

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::EventLoop::run(EventLoop *this,uint maxTurnCount)

{
  Event *pEVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  this->running = true;
  if (maxTurnCount != 0) {
    iVar3 = maxTurnCount - 1;
    do {
      bVar2 = turn(this);
      bVar4 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar2 && bVar4);
  }
  pEVar1 = this->head;
  if (this->lastRunnableState != (pEVar1 != (Event *)0x0)) {
    (*this->port->_vptr_EventPort[2])(this->port,(ulong)(pEVar1 != (Event *)0x0));
    this->lastRunnableState = pEVar1 != (Event *)0x0;
  }
  this->running = false;
  return;
}

Assistant:

void EventLoop::run(uint maxTurnCount) {
  running = true;
  KJ_DEFER(running = false);

  for (uint i = 0; i < maxTurnCount; i++) {
    if (!turn()) {
      break;
    }
  }

  setRunnable(isRunnable());
}